

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mine.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::Mine::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,Mine *this)

{
  KBOOL KVar1;
  bool bVar2;
  ostream *poVar3;
  byte *pbVar4;
  pointer ppVar5;
  size_type sVar6;
  pointer pVVar7;
  KString local_320;
  KString local_300;
  __normal_iterator<const_KDIS::DATA_TYPE::Vector_*,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>
  local_2e0;
  const_iterator citrVEnd;
  const_iterator citrV;
  const_iterator citrMEnd;
  const_iterator citrM;
  KString local_2a0;
  __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_280;
  const_iterator citrEnd;
  const_iterator citr;
  KString local_250;
  KString local_230;
  KString local_210;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Mine *local_18;
  Mine *this_local;
  
  local_18 = this;
  this_local = (Mine *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar3 = std::operator<<(local_190,"Mine:");
  poVar3 = std::operator<<(poVar3,"\n\tLocation: ");
  Vector::GetAsString_abi_cxx11_(&local_1d0,&this->m_Loc);
  poVar3 = std::operator<<(poVar3,(string *)&local_1d0);
  poVar3 = std::operator<<(poVar3,"\n\tID: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,this->m_ui16ID);
  std::operator<<(poVar3,"\n");
  std::__cxx11::string::~string((string *)&local_1d0);
  KVar1 = MinefieldDataFilter::IsGroundBurialDepthOffset(&this->super_MinefieldDataFilter);
  if (KVar1) {
    poVar3 = std::operator<<(local_190,"\tGround Burial Offset: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(float)this->m_f32GrndOffset);
    std::operator<<(poVar3,"\n");
  }
  KVar1 = MinefieldDataFilter::IsWaterBurialDepthOffset(&this->super_MinefieldDataFilter);
  if (KVar1) {
    poVar3 = std::operator<<(local_190,"\tWater Burial Offset: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(float)this->m_f32WtrOffset);
    std::operator<<(poVar3,"\n");
  }
  KVar1 = MinefieldDataFilter::IsSnowBurialDepthOffset(&this->super_MinefieldDataFilter);
  if (KVar1) {
    poVar3 = std::operator<<(local_190,"\tSnow Burial Offset: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(float)this->m_f32SnwOffset);
    std::operator<<(poVar3,"\n");
  }
  KVar1 = MinefieldDataFilter::IsMineOrientation(&this->super_MinefieldDataFilter);
  if (KVar1) {
    poVar3 = std::operator<<(local_190,"\tOrientation: ");
    EulerAngles::GetAsString_abi_cxx11_(&local_1f0,&this->m_Ori);
    std::operator<<(poVar3,(string *)&local_1f0);
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  KVar1 = MinefieldDataFilter::IsThermalContrast(&this->super_MinefieldDataFilter);
  if (KVar1) {
    poVar3 = std::operator<<(local_190,"\tThermal Contrast: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(float)this->m_f32ThrmCont);
    std::operator<<(poVar3,"\n");
  }
  KVar1 = MinefieldDataFilter::IsReflectance(&this->super_MinefieldDataFilter);
  if (KVar1) {
    poVar3 = std::operator<<(local_190,"\tReflectance: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(float)this->m_f32Rflt);
    std::operator<<(poVar3,"\n");
  }
  KVar1 = MinefieldDataFilter::IsMineEmplacementAge(&this->super_MinefieldDataFilter);
  if (KVar1) {
    poVar3 = std::operator<<(local_190,"\tMine Emplacement Age:\n");
    ClockTime::GetAsString_abi_cxx11_(&local_230,&this->m_MET);
    UTILS::IndentString(&local_210,&local_230,2,'\t');
    std::operator<<(poVar3,(string *)&local_210);
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_230);
  }
  KVar1 = MinefieldDataFilter::IsFusing(&this->super_MinefieldDataFilter);
  if (KVar1) {
    MineFusing::GetAsString_abi_cxx11_((KString *)&citr,&this->m_MF);
    UTILS::IndentString(&local_250,(KString *)&citr,1,'\t');
    std::operator<<(local_190,(string *)&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&citr);
  }
  KVar1 = MinefieldDataFilter::IsScalarDetectionCoefficient(&this->super_MinefieldDataFilter);
  if (KVar1) {
    std::operator<<(local_190,"\tScalar Detection Coefficients:\n");
    citrEnd = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(&this->m_vui8SDC);
    local_280._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&this->m_vui8SDC);
    while (bVar2 = __gnu_cxx::operator!=(&citrEnd,&local_280), bVar2) {
      poVar3 = std::operator<<(local_190,"\t\t");
      pbVar4 = __gnu_cxx::
               __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               ::operator*(&citrEnd);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)*pbVar4);
      std::operator<<(poVar3,"\n");
      __gnu_cxx::
      __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::operator++(&citrEnd);
    }
  }
  KVar1 = MinefieldDataFilter::IsPaintScheme(&this->super_MinefieldDataFilter);
  if (KVar1) {
    MinePaintScheme::GetAsString_abi_cxx11_((KString *)&citrM,&this->m_MPS);
    UTILS::IndentString(&local_2a0,(KString *)&citrM,1,'\t');
    std::operator<<(local_190,(string *)&local_2a0);
    std::__cxx11::string::~string((string *)&local_2a0);
    std::__cxx11::string::~string((string *)&citrM);
  }
  KVar1 = MinefieldDataFilter::IsTripDetonationWire(&this->super_MinefieldDataFilter);
  if (KVar1) {
    poVar3 = std::operator<<(local_190,"\tNumber Trip/Det Wires: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)this->m_ui8NumTrpDetWrs);
    std::operator<<(poVar3,"\n");
    citrMEnd = std::
               map<unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>_>_>
               ::begin(&this->m_mvVertices);
    citrV._M_current =
         (Vector *)
         std::
         map<unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>_>_>
         ::end(&this->m_mvVertices);
    while (bVar2 = std::operator!=(&citrMEnd,(_Self *)&citrV), bVar2) {
      poVar3 = std::operator<<(local_190,"\tNumber Of Vertices: ");
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>_>
               ::operator->(&citrMEnd);
      sVar6 = std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>::size
                        (&ppVar5->second);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,sVar6);
      std::operator<<(poVar3,"\n");
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>_>
               ::operator->(&citrMEnd);
      citrVEnd = std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>::
                 begin(&ppVar5->second);
      ppVar5 = std::
               _Rb_tree_const_iterator<std::pair<const_unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>_>
               ::operator->(&citrMEnd);
      local_2e0._M_current =
           (Vector *)
           std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>::end
                     (&ppVar5->second);
      while (bVar2 = __gnu_cxx::operator!=(&citrVEnd,&local_2e0), bVar2) {
        pVVar7 = __gnu_cxx::
                 __normal_iterator<const_KDIS::DATA_TYPE::Vector_*,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>
                 ::operator->(&citrVEnd);
        (*(pVVar7->super_DataTypeBase)._vptr_DataTypeBase[2])(&local_320);
        UTILS::IndentString(&local_300,&local_320,2,'\t');
        std::operator<<(local_190,(string *)&local_300);
        std::__cxx11::string::~string((string *)&local_300);
        std::__cxx11::string::~string((string *)&local_320);
        __gnu_cxx::
        __normal_iterator<const_KDIS::DATA_TYPE::Vector_*,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>
        ::operator++(&citrVEnd);
      }
      std::
      _Rb_tree_const_iterator<std::pair<const_unsigned_short,_std::vector<KDIS::DATA_TYPE::Vector,_std::allocator<KDIS::DATA_TYPE::Vector>_>_>_>
      ::operator++(&citrMEnd);
    }
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Mine::GetAsString() const
{
    KStringStream ss;

    ss << "Mine:"
       << "\n\tLocation: " << m_Loc.GetAsString()
       << "\n\tID: "       << m_ui16ID
       << "\n";

    if( IsGroundBurialDepthOffset() )
    {
        ss << "\tGround Burial Offset: " << m_f32GrndOffset << "\n";
    }

    if( IsWaterBurialDepthOffset() )
    {
        ss << "\tWater Burial Offset: " << m_f32WtrOffset << "\n";
    }

    if( IsSnowBurialDepthOffset() )
    {
        ss << "\tSnow Burial Offset: " << m_f32SnwOffset << "\n";
    }

    if( IsMineOrientation() )
    {
        ss << "\tOrientation: " << m_Ori.GetAsString();
    }

    if( IsThermalContrast() )
    {
        ss << "\tThermal Contrast: " << m_f32ThrmCont << "\n";
    }

    if( IsReflectance() )
    {
        ss << "\tReflectance: " << m_f32Rflt << "\n";
    }

    if( IsMineEmplacementAge() )
    {
        ss << "\tMine Emplacement Age:\n" << IndentString( m_MET.GetAsString(), 2 );
    }

    if( IsFusing() )
    {
        ss << IndentString( m_MF.GetAsString(), 1 );
    }

    if( IsScalarDetectionCoefficient() )
    {
        ss << "\tScalar Detection Coefficients:\n";
        vector<KUINT8>::const_iterator citr = m_vui8SDC.begin();
        vector<KUINT8>::const_iterator citrEnd = m_vui8SDC.end();
        for( ; citr != citrEnd; ++citr )
        {
            ss << "\t\t" << ( KUINT16 )*citr << "\n";
        }
    }

    if( IsPaintScheme() )
    {
        ss << IndentString( m_MPS.GetAsString(), 1 );
    }

    if( IsTripDetonationWire() )
    {
        ss << "\tNumber Trip/Det Wires: " << ( KUINT16 )m_ui8NumTrpDetWrs << "\n";

        map< KUINT16, vector<Vector> >::const_iterator citrM = m_mvVertices.begin();
        map< KUINT16, vector<Vector> >::const_iterator citrMEnd = m_mvVertices.end();
        for( ; citrM != citrMEnd; ++citrM )
        {
            ss << "\tNumber Of Vertices: " << citrM->second.size() << "\n";

            vector<Vector>::const_iterator citrV = citrM->second.begin();
            vector<Vector>::const_iterator citrVEnd = citrM->second.end();
            for( ; citrV != citrVEnd; ++citrV )
            {
                ss << IndentString( citrV->GetAsString(), 2 );
            }
        }
    }

    return ss.str();
}